

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O0

void fiobj_str_resize(FIOBJ str,size_t size)

{
  size_t sVar1;
  fio_str_info_s local_30;
  size_t local_18;
  size_t size_local;
  FIOBJ str_local;
  
  local_18 = size;
  size_local = str;
  sVar1 = fiobj_type_is(str,FIOBJ_T_STRING);
  if (sVar1 != 0) {
    fio_str_resize(&local_30,(fio_str_s_conflict *)((size_local & 0xfffffffffffffff8) + 0x10),
                   local_18);
    *(undefined8 *)((size_local & 0xfffffffffffffff8) + 8) = 0;
    return;
  }
  __assert_fail("FIOBJ_TYPE_IS(str, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                ,0xdd,"void fiobj_str_resize(FIOBJ, size_t)");
}

Assistant:

void fiobj_str_resize(FIOBJ str, size_t size) {
  assert(FIOBJ_TYPE_IS(str, FIOBJ_T_STRING));
  fio_str_resize(&obj2str(str)->str, size);
  obj2str(str)->hash = 0;
  return;
}